

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

ArrayIndex __thiscall
anon_unknown.dwarf_ab3c04::Target::AddSourceCompileGroup
          (Target *this,cmSourceFile *sf,ArrayIndex si)

{
  ArrayIndex AVar1;
  bool bVar2;
  size_type sVar3;
  pointer ppVar4;
  reference pvVar5;
  pair<std::__detail::_Node_iterator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_false,_true>,_bool>
  pVar6;
  Value local_198;
  undefined1 local_170 [8];
  CompileGroup g;
  uint local_11c;
  _Node_iterator_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
  _Stack_118;
  ArrayIndex cgIndex;
  _Node_iterator_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
  local_100;
  iterator i;
  CompileData compileData;
  ArrayIndex si_local;
  cmSourceFile *sf_local;
  Target *this_local;
  
  BuildCompileData((CompileData *)&i,this,sf);
  local_100._M_cur =
       (__node_type *)
       std::
       unordered_map<(anonymous_namespace)::CompileData,_unsigned_int,_std::hash<(anonymous_namespace)::CompileData>,_std::equal_to<(anonymous_namespace)::CompileData>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>_>
       ::find(&this->CompileGroupMap,(CompileData *)&i);
  _Stack_118._M_cur =
       (__node_type *)
       std::
       unordered_map<(anonymous_namespace)::CompileData,_unsigned_int,_std::hash<(anonymous_namespace)::CompileData>,_std::equal_to<(anonymous_namespace)::CompileData>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>_>
       ::end(&this->CompileGroupMap);
  bVar2 = std::__detail::operator==(&local_100,&stack0xfffffffffffffee8);
  if (bVar2) {
    sVar3 = std::
            vector<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
            ::size(&this->CompileGroups);
    local_11c = (uint)sVar3;
    pVar6 = std::
            unordered_map<(anonymous_namespace)::CompileData,unsigned_int,std::hash<(anonymous_namespace)::CompileData>,std::equal_to<(anonymous_namespace)::CompileData>,std::allocator<std::pair<(anonymous_namespace)::CompileData_const,unsigned_int>>>
            ::emplace<(anonymous_namespace)::CompileData,unsigned_int&>
                      ((unordered_map<(anonymous_namespace)::CompileData,unsigned_int,std::hash<(anonymous_namespace)::CompileData>,std::equal_to<(anonymous_namespace)::CompileData>,std::allocator<std::pair<(anonymous_namespace)::CompileData_const,unsigned_int>>>
                        *)&this->CompileGroupMap,(CompileData *)&i,&local_11c);
    g.SourceIndexes.limit_ =
         (ptrdiff_t)
         pVar6.first.
         super__Node_iterator_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
         ._M_cur;
    local_100._M_cur = (__node_type *)g.SourceIndexes.limit_;
    CompileGroup::CompileGroup((CompileGroup *)local_170);
    local_170 = (undefined1  [8])local_100._M_cur;
    std::
    vector<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
    ::push_back(&this->CompileGroups,(value_type *)local_170);
    CompileGroup::~CompileGroup((CompileGroup *)local_170);
  }
  ppVar4 = std::__detail::
           _Node_iterator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_false,_true>
                         *)&local_100);
  pvVar5 = std::
           vector<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
           ::operator[](&this->CompileGroups,(ulong)ppVar4->second);
  Json::Value::Value(&local_198,si);
  Json::Value::append(&pvVar5->SourceIndexes,&local_198);
  Json::Value::~Value(&local_198);
  ppVar4 = std::__detail::
           _Node_iterator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_false,_true>
                         *)&local_100);
  AVar1 = ppVar4->second;
  CompileData::~CompileData((CompileData *)&i);
  return AVar1;
}

Assistant:

Json::ArrayIndex Target::AddSourceCompileGroup(cmSourceFile* sf,
                                               Json::ArrayIndex si)
{
  CompileData compileData = this->BuildCompileData(sf);
  auto i = this->CompileGroupMap.find(compileData);
  if (i == this->CompileGroupMap.end()) {
    Json::ArrayIndex cgIndex =
      static_cast<Json::ArrayIndex>(this->CompileGroups.size());
    i = this->CompileGroupMap.emplace(std::move(compileData), cgIndex).first;
    CompileGroup g;
    g.Entry = i;
    this->CompileGroups.push_back(std::move(g));
  }
  this->CompileGroups[i->second].SourceIndexes.append(si);
  return i->second;
}